

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::createDbgsymDDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *logger;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues_00;
  string shLibsFilename;
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  char *__lhs;
  undefined8 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbd0;
  allocator<char> local_429;
  string in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbf8;
  allocator<char> local_405;
  allocator<char> local_404;
  allocator<char> local_403;
  allocator<char> local_402;
  allocator<char> local_401;
  string in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc20;
  allocator<char> in_stack_fffffffffffffc28;
  _Vector_impl_data in_stack_fffffffffffffc30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  char *local_368;
  key_type local_360;
  DebGenerator gen;
  string local_1b8;
  string local_198;
  string packageNameLower;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  string local_140 [32];
  string local_120 [32];
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator<char> *)&stack0xfffffffffffffc08);
  pcVar2 = cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,pcVar2,(allocator<char> *)&stack0xfffffffffffffc28);
  cmsys::SystemTools::LowerCase(&packageNameLower,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",
             (allocator<char> *)&stack0xfffffffffffffbd8);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 &packageNameLower,"-dbgsym");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"Package",
             (allocator<char> *)&stack0xfffffffffffffc08);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Package-Type",(allocator<char> *)&stack0xfffffffffffffbd8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Version",(allocator<char> *)&stack0xfffffffffffffbd8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Auto-Built-Package",(allocator<char> *)&stack0xfffffffffffffbd8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc28,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator<char> *)&local_198);
  __lhs = cmCPackGenerator::GetOption
                    (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffc28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388," (= ",(allocator<char> *)&local_1b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffc08,__lhs,&local_388);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffc08,pcVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbd8,")");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Depends",&local_429);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_360);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Section",(allocator<char> *)&stack0xfffffffffffffbd8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Priority",(allocator<char> *)&stack0xfffffffffffffbd8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator<char> *)&stack0xfffffffffffffc08);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"Architecture",
             (allocator<char> *)&stack0xfffffffffffffc28);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",
             (allocator<char> *)&stack0xfffffffffffffc08);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"Maintainer",
             (allocator<char> *)&stack0xfffffffffffffc28);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"debug symbols for ",
             (allocator<char> *)&stack0xfffffffffffffc28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbd8,&packageNameLower);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc08,"Description",(allocator<char> *)&local_388);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffc08);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",
             (allocator<char> *)&stack0xfffffffffffffbd8);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Source",(allocator<char> *)&stack0xfffffffffffffbd8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_BUILD_IDS",(allocator<char> *)&stack0xfffffffffffffbd8);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Build-Ids",(allocator<char> *)&stack0xfffffffffffffbd8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",&local_429);
  pcVar2 = cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffbd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,pcVar2,(allocator<char> *)&stack0xfffffffffffffc07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc08,"GEN_DBGSYMDIR",
             (allocator<char> *)&stack0xfffffffffffffc06);
  pcVar2 = cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffc08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar2,(allocator<char> *)&stack0xfffffffffffffc05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc28,"CPACK_TOPLEVEL_DIRECTORY",
             (allocator<char> *)&stack0xfffffffffffffc04);
  pcVar2 = cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffc28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,pcVar2,(allocator<char> *)&stack0xfffffffffffffc03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"CPACK_TEMPORARY_DIRECTORY",
             (allocator<char> *)&stack0xfffffffffffffc02);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,pcVar2,(allocator<char> *)&stack0xfffffffffffffc01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",
             (allocator<char> *)&stack0xfffffffffffffc00);
  pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE",&local_401);
  local_368 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"",&local_402);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"",&local_403);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"",&local_404);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",&local_405);
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158,&this->packageFiles);
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  controlValues_00._M_t._M_impl._0_8_ = &local_60;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_120;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_140;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shLibsFilename.field_2._M_allocated_capacity = (size_type)&local_158;
  shLibsFilename._M_dataplus._M_p = (pointer)SUB168(ZEXT116(bVar1) << 0x40,0);
  shLibsFilename._M_string_length = SUB168(ZEXT116(bVar1) << 0x40,8);
  shLibsFilename.field_2._8_8_ = in_stack_fffffffffffffbc8;
  anon_unknown.dwarf_fd271::DebGenerator::DebGenerator
            (&gen,logger,&local_a0,&local_c0,&local_e0,&local_100,pcVar2,local_368,controlValues_00,
             SUB81(local_80,0),shLibsFilename,(bool)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbd8,(bool)in_stack_fffffffffffffbf8,in_stack_fffffffffffffc00,
             (char *)in_stack_fffffffffffffc20,(bool)in_stack_fffffffffffffc28,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffffc30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc28);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
  bVar1 = anon_unknown.dwarf_fd271::DebGenerator::generate(&gen);
  anon_unknown.dwarf_fd271::DebGenerator::~DebGenerator(&gen);
  std::__cxx11::string::~string((string *)&packageNameLower);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return (uint)bVar1;
}

Assistant:

int cmCPackDebGenerator::createDbgsymDDeb()
{
  // Packages containing debug symbols follow the same structure as .debs
  // but have different metadata and content.

  std::map<std::string, std::string> controlValues;
  // debian policy enforce lower case for package name
  std::string packageNameLower = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  const char* debian_pkg_version =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");

  controlValues["Package"] = packageNameLower + "-dbgsym";
  controlValues["Package-Type"] = "ddeb";
  controlValues["Version"] = debian_pkg_version;
  controlValues["Auto-Built-Package"] = "debug-symbols";
  controlValues["Depends"] = this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") +
    std::string(" (= ") + debian_pkg_version + ")";
  controlValues["Section"] = "debug";
  controlValues["Priority"] = "optional";
  controlValues["Architecture"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    std::string("debug symbols for ") + packageNameLower;

  const char* debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (debian_pkg_source && *debian_pkg_source) {
    controlValues["Source"] = debian_pkg_source;
  }
  const char* debian_build_ids = this->GetOption("GEN_BUILD_IDS");
  if (debian_build_ids && *debian_build_ids) {
    controlValues["Build-Ids"] = debian_build_ids;
  }

  DebGenerator gen(
    Logger, this->GetOption("GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME"),
    this->GetOption("GEN_DBGSYMDIR"),

    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, false, "",
    false, "", false, "", nullptr,
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    packageFiles);

  if (!gen.generate()) {
    return 0;
  }
  return 1;
}